

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<ClassDef>::reallocateAndGrow
          (QArrayDataPointer<ClassDef> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<ClassDef> *old)

{
  QArrayData *data;
  Data *pDVar1;
  ClassDef *pCVar2;
  qsizetype qVar3;
  long lVar4;
  ClassDef *pCVar5;
  ClassDef *pCVar6;
  long in_FS_OFFSET;
  pair<QArrayData_*,_void_*> pVar7;
  QArrayDataPointer<ClassDef> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((old == (QArrayDataPointer<ClassDef> *)0x0 && where == GrowsAtEnd) &&
       (data = &this->d->super_QArrayData, data != (QArrayData *)0x0)) && (0 < n)) &&
     ((data->ref_)._q_value.super___atomic_base<int>._M_i < 2)) {
    pVar7 = QArrayData::reallocateUnaligned
                      (data,this->ptr,0x1a8,
                       n + this->size +
                       ((long)((long)this->ptr -
                              ((ulong)((long)&data[1].alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
                       0x21cfb2b78c13521d,Grow);
    this->d = (Data *)pVar7.first;
    this->ptr = (ClassDef *)pVar7.second;
  }
  else {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (ClassDef *)&DAT_aaaaaaaaaaaaaaaa;
    allocateGrow(&local_58,this,n,where);
    pCVar2 = local_58.ptr;
    if (this->size != 0) {
      lVar4 = this->size + (n >> 0x3f & n);
      if (((this->d == (Data *)0x0) || (old != (QArrayDataPointer<ClassDef> *)0x0)) ||
         (1 < (this->d->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
        pCVar6 = this->ptr;
        pCVar5 = pCVar6 + lVar4;
        if ((lVar4 != 0) && (0 < lVar4)) {
          do {
            ClassDef::ClassDef(pCVar2 + local_58.size,pCVar6);
            pCVar6 = pCVar6 + 1;
            local_58.size = local_58.size + 1;
          } while (pCVar6 < pCVar5);
        }
      }
      else {
        pCVar6 = this->ptr;
        pCVar5 = pCVar6 + lVar4;
        if ((lVar4 != 0) && (0 < lVar4)) {
          do {
            ClassDef::ClassDef(pCVar2 + local_58.size,pCVar6);
            pCVar6 = pCVar6 + 1;
            local_58.size = local_58.size + 1;
          } while (pCVar6 < pCVar5);
        }
      }
    }
    pDVar1 = this->d;
    pCVar2 = this->ptr;
    this->d = local_58.d;
    this->ptr = local_58.ptr;
    qVar3 = this->size;
    this->size = local_58.size;
    local_58.d = pDVar1;
    local_58.ptr = pCVar2;
    local_58.size = qVar3;
    if (old != (QArrayDataPointer<ClassDef> *)0x0) {
      local_58.d = old->d;
      local_58.ptr = old->ptr;
      old->d = pDVar1;
      old->ptr = pCVar2;
      local_58.size = old->size;
      old->size = qVar3;
    }
    ~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }